

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::HandleDiagGetAnswer(CommissionerImpl *this,Request *aRequest)

{
  char cVar1;
  ErrorCode EVar2;
  char *pcVar3;
  Error *pEVar4;
  char *pcVar5;
  ByteArray *extraout_RDX;
  ByteArray *aBytes;
  ByteArray *extraout_RDX_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  allocator local_f9;
  undefined1 local_f8 [8];
  _Alloc_hider _Stack_f0;
  undefined1 local_e8 [24];
  code *local_d0;
  string local_c8;
  string local_a8;
  writer write;
  string peerAddr;
  Error error;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(local_f8);
  Address::ToString_abi_cxx11_(&peerAddr,(Address *)local_f8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
  std::__cxx11::string::string((string *)&local_a8,"meshdiag",(allocator *)&write);
  local_f8._0_4_ = 0xd;
  _Stack_f0._M_p = "received DIAG_GET.ans from {}";
  local_e8._0_8_ = (pointer)0x1d;
  local_e8._8_8_ = 0x100000000;
  local_d0 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  pcVar3 = "received DIAG_GET.ans from {}";
  local_e8._16_8_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_f8;
  while (pcVar5 = pcVar3, pcVar5 != "") {
    pcVar3 = pcVar5 + 1;
    if (*pcVar5 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar5 + 2;
    }
    else if (*pcVar5 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar5,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_f8);
    }
  }
  local_f8 = (undefined1  [8])peerAddr._M_dataplus._M_p;
  _Stack_f0._M_p = (pointer)peerAddr._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_f8;
  ::fmt::v10::vformat_abi_cxx11_(&local_c8,(v10 *)"received DIAG_GET.ans from {}",fmt,args);
  Log(kInfo,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  internal::DecodeNetDiagData((Error *)local_f8,&this->mDiagAnsTlvs,&aRequest->mPayload);
  pEVar4 = Error::operator=(&error,(Error *)local_f8);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)&_Stack_f0);
  if (EVar2 == kNone) {
    std::__cxx11::string::string((string *)&local_a8,"meshdiag",&local_f9);
    local_f8._0_4_ = 0xd;
    _Stack_f0._M_p = "accepted DIAG_GET.ans data {}";
    local_e8._0_8_ = (pointer)0x1d;
    local_e8._8_8_ = 0x100000000;
    local_d0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar3 = "accepted DIAG_GET.ans data {}";
    aBytes = extraout_RDX;
    local_e8._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_f8;
    while (pcVar5 = pcVar3, pcVar5 != "") {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_f8);
        aBytes = extraout_RDX_00;
      }
    }
    utils::Hex_abi_cxx11_((string *)local_f8,(utils *)&aRequest->mPayload,aBytes);
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_f8;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x1d;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&write;
    ::fmt::v10::vformat_abi_cxx11_(&local_c8,(v10 *)"accepted DIAG_GET.ans data {}",fmt_00,args_00);
    Log(kInfo,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)&local_a8);
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[6])
              (this->mCommissionerHandler,&peerAddr,&this->mDiagAnsTlvs);
  }
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)&local_a8,"meshdiag",&local_f9);
    local_f8._0_4_ = 0xd;
    _Stack_f0._M_p = "failed to handle DIAG_GET.ans from {}";
    local_e8._0_8_ = (pointer)0x25;
    local_e8._8_8_ = 0x100000000;
    local_d0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar3 = "failed to handle DIAG_GET.ans from {}";
    local_e8._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_f8;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_f8;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar5 = pcVar3;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar3,"");
          goto LAB_00150959;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar3,pcVar5);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar5,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_f8);
    }
LAB_00150959:
    local_f8 = (undefined1  [8])peerAddr._M_dataplus._M_p;
    _Stack_f0._M_p = (pointer)peerAddr._M_string_length;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x25;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"failed to handle DIAG_GET.ans from {}",fmt_01,args_01);
    Log(kError,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&peerAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::HandleDiagGetAnswer(const coap::Request &aRequest)
{
    Error       error;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MESHDIAG, "received DIAG_GET.ans from {}", peerAddr);
    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = internal::DecodeNetDiagData(mDiagAnsTlvs, aRequest.GetPayload()));
    LOG_INFO(LOG_REGION_MESHDIAG, "accepted DIAG_GET.ans data {}", utils::Hex(aRequest.GetPayload()));

    mCommissionerHandler.OnDiagGetAnswerMessage(peerAddr, mDiagAnsTlvs);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_MESHDIAG, "failed to handle DIAG_GET.ans from {}", peerAddr);
    }
}